

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_arpeggio(xm_context_t *ctx,xm_channel_context_t *ch,uint8_t param,uint16_t tick)

{
  uint uVar1;
  ushort in_CX;
  byte in_DL;
  xm_context_t *in_RSI;
  undefined1 in_stack_ffffffffffffffee;
  
  uVar1 = (uint)in_CX % 3;
  if (uVar1 == 0) {
    (in_RSI->module).pattern_table[0x3c] = '\0';
    (in_RSI->module).pattern_table[0x3d] = '\0';
  }
  else if (uVar1 == 1) {
    (in_RSI->module).pattern_table[0x3c] = '\x01';
    (in_RSI->module).pattern_table[0x3d] = in_DL & 0xf;
  }
  else if (uVar1 == 2) {
    (in_RSI->module).pattern_table[0x3c] = '\x01';
    (in_RSI->module).pattern_table[0x3d] = (uint8_t)((int)(uint)in_DL >> 4);
  }
  xm_update_frequency(in_RSI,(xm_channel_context_t *)
                             CONCAT17(in_DL,CONCAT16(in_stack_ffffffffffffffee,CONCAT24(in_CX,uVar1)
                                                    )));
  return;
}

Assistant:

static void xm_arpeggio(xm_context_t* ctx, xm_channel_context_t* ch, uint8_t param, uint16_t tick) {
	switch(tick % 3) {
	case 0:
		ch->arp_in_progress = false;
		ch->arp_note_offset = 0;
		break;
	case 2:
		ch->arp_in_progress = true;
		ch->arp_note_offset = param >> 4;
		break;
	case 1:
		ch->arp_in_progress = true;
		ch->arp_note_offset = param & 0x0F;
		break;
	}

	xm_update_frequency(ctx, ch);
}